

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

int Abc_NtkDarAbSec(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int nFrames,int fVerbose)

{
  int iVar1;
  Aig_Man_t *p;
  Aig_Man_t *p_00;
  char *format;
  
  p = Abc_NtkToDar(pNtk1,0,1);
  iVar1 = (int)pNtk1;
  if (p != (Aig_Man_t *)0x0) {
    if (p->nRegs < 1) {
      __assert_fail("Aig_ManRegNum(pMan1) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                    ,0xbf4,"int Abc_NtkDarAbSec(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
    }
    if (pNtk2 == (Abc_Ntk_t *)0x0) {
      p_00 = (Aig_Man_t *)0x0;
LAB_0024d01f:
      iVar1 = Ssw_SecSpecialMiter(p,p_00,nFrames,fVerbose);
      Aig_ManStop(p);
      if (p_00 == (Aig_Man_t *)0x0) {
        return iVar1;
      }
      Aig_ManStop(p_00);
      return iVar1;
    }
    p_00 = Abc_NtkToDar(pNtk2,0,1);
    if (p_00 != (Aig_Man_t *)0x0) {
      if (p_00->nRegs < 1) {
        __assert_fail("Aig_ManRegNum(pMan2) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                      ,0xbff,"int Abc_NtkDarAbSec(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
      }
      if (p->nTruePis == p_00->nTruePis) {
        if (p->nTruePos == p_00->nTruePos) {
          if (p->nRegs == p_00->nRegs) goto LAB_0024d01f;
          Aig_ManStop(p);
          Aig_ManStop(p_00);
          iVar1 = (int)p_00;
          format = "The networks have different number of flops.\n";
        }
        else {
          Aig_ManStop(p);
          Aig_ManStop(p_00);
          iVar1 = (int)p_00;
          format = "The networks have different number of POs.\n";
        }
      }
      else {
        Aig_ManStop(p);
        Aig_ManStop(p_00);
        iVar1 = (int)p_00;
        format = "The networks have different number of PIs.\n";
      }
      goto LAB_0024d057;
    }
    Aig_ManStop(p);
    iVar1 = (int)p;
  }
  format = "Converting miter into AIG has failed.\n";
LAB_0024d057:
  Abc_Print(iVar1,format);
  return -1;
}

Assistant:

int Abc_NtkDarAbSec( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nFrames, int fVerbose )
{
    Aig_Man_t * pMan1, * pMan2 = NULL;
    int RetValue;
    // derive AIG manager
    pMan1 = Abc_NtkToDar( pNtk1, 0, 1 );
    if ( pMan1 == NULL )
    {
        Abc_Print( 1, "Converting miter into AIG has failed.\n" );
        return -1;
    }
    assert( Aig_ManRegNum(pMan1) > 0 );
    // derive AIG manager
    if ( pNtk2 )
    {
        pMan2 = Abc_NtkToDar( pNtk2, 0, 1 );
        if ( pMan2 == NULL )
        {
            Aig_ManStop( pMan1 );
            Abc_Print( 1, "Converting miter into AIG has failed.\n" );
            return -1;
        }
        assert( Aig_ManRegNum(pMan2) > 0 );
        if ( Saig_ManPiNum(pMan1) != Saig_ManPiNum(pMan2) )
        {
            Aig_ManStop( pMan1 );
            Aig_ManStop( pMan2 );
            Abc_Print( 1, "The networks have different number of PIs.\n" );
            return -1;
        }
        if ( Saig_ManPoNum(pMan1) != Saig_ManPoNum(pMan2) )
        {
            Aig_ManStop( pMan1 );
            Aig_ManStop( pMan2 );
            Abc_Print( 1, "The networks have different number of POs.\n" );
            return -1;
        }
        if ( Aig_ManRegNum(pMan1) != Aig_ManRegNum(pMan2) )
        {
            Aig_ManStop( pMan1 );
            Aig_ManStop( pMan2 );
            Abc_Print( 1, "The networks have different number of flops.\n" );
            return -1;
        }
    }
    // perform verification
    RetValue = Ssw_SecSpecialMiter( pMan1, pMan2, nFrames, fVerbose );
    Aig_ManStop( pMan1 );
    if ( pMan2 )
        Aig_ManStop( pMan2 );
    return RetValue;
}